

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_service_client_send_function_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice,t_function *tfunction,
          bool needs_protocol)

{
  t_type *returntype;
  bool bVar1;
  string *psVar2;
  t_struct *ptVar3;
  ostream *poVar4;
  reference pptVar5;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> *p_Var6;
  char *pcVar7;
  char *local_240;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_210
  ;
  t_field *local_208;
  t_field *tfield_1;
  t_field **local_1f8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1f0
  ;
  const_iterator f_iter_1;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields_1;
  t_field *local_1d8;
  t_field *tfield;
  t_field **local_1c8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1c0
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_190;
  allocator local_169;
  string local_168 [8];
  string proto;
  t_struct *arg_struct;
  string argsname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  t_function send_function;
  string funname;
  bool needs_protocol_local;
  t_function *tfunction_local;
  t_service *tservice_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  psVar2 = t_function::get_name_abi_cxx11_(tfunction);
  std::__cxx11::string::string((string *)&send_function.own_xceptions_,(string *)psVar2);
  returntype = g_type_bool;
  psVar2 = t_function::get_name_abi_cxx11_(tfunction);
  std::operator+(&local_110,"send_",psVar2);
  ptVar3 = t_function::get_arglist(tfunction);
  t_function::t_function((t_function *)local_f0,returntype,&local_110,ptVar3,false);
  std::__cxx11::string::~string((string *)&local_110);
  function_args_helper_struct_type_abi_cxx11_((string *)&arg_struct,this,tservice,tfunction);
  proto.field_2._8_8_ = t_function::get_arglist(tfunction);
  if (needs_protocol) {
    local_240 = "on outProtocol";
    if ((this->gen_cocoa_ & 1U) != 0) {
      local_240 = "__outProtocol";
    }
  }
  else {
    local_240 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,local_240,&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"private func ");
  psVar2 = t_function::get_name_abi_cxx11_((t_function *)local_f0);
  poVar4 = std::operator<<(poVar4,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"(");
  ptVar3 = t_function::get_arglist(tfunction);
  std::__cxx11::string::string((string *)&fields,local_168);
  argument_list(&local_190,this,ptVar3,(string *)&fields,true);
  poVar4 = std::operator<<(poVar4,(string *)&local_190);
  std::operator<<(poVar4,") throws");
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&fields);
  block_open(this,out);
  if ((this->gen_cocoa_ & 1U) == 0) {
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try outProtocol.writeMessageBegin(name: \"");
    poVar4 = std::operator<<(poVar4,(string *)&send_function.own_xceptions_);
    poVar4 = std::operator<<(poVar4,"\", ");
    poVar4 = std::operator<<(poVar4,"type: ");
    bVar1 = t_function::is_oneway(tfunction);
    pcVar7 = ".call";
    if (bVar1) {
      pcVar7 = ".oneway";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,"sequenceID: 0)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"let args = ");
    poVar4 = std::operator<<(poVar4,(string *)&arg_struct);
    std::operator<<(poVar4,"(");
    f_iter._M_current = (t_field **)t_struct::get_members((t_struct *)proto.field_2._8_8_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_1c0);
    local_1c8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_1c0._M_current = local_1c8;
    while( true ) {
      tfield = (t_field *)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                         ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1c0,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&tfield);
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1c0);
      local_1d8 = *pptVar5;
      psVar2 = t_field::get_name_abi_cxx11_(local_1d8);
      poVar4 = std::operator<<(out,(string *)psVar2);
      poVar4 = std::operator<<(poVar4,": ");
      psVar2 = t_field::get_name_abi_cxx11_(local_1d8);
      std::operator<<(poVar4,(string *)psVar2);
      p_Var6 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator++(&local_1c0);
      fields_1 = (vector<t_field_*,_std::allocator<t_field_*>_> *)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (p_Var6,(__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                 *)&fields_1);
      if (bVar1) {
        std::operator<<(out,", ");
      }
    }
    poVar4 = std::operator<<(out,")");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try args.write(to: outProtocol)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try outProtocol.writeMessageEnd()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  else {
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try __outProtocol.writeMessageBeginWithName(\"");
    poVar4 = std::operator<<(poVar4,(string *)&send_function.own_xceptions_);
    poVar4 = std::operator<<(poVar4,"\", ");
    poVar4 = std::operator<<(poVar4,"type: ");
    bVar1 = t_function::is_oneway(tfunction);
    pcVar7 = ".CALL";
    if (bVar1) {
      pcVar7 = ".ONEWAY";
    }
    poVar4 = std::operator<<(poVar4,pcVar7);
    poVar4 = std::operator<<(poVar4,", ");
    poVar4 = std::operator<<(poVar4,"sequenceID: 0)");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"let __args = ");
    poVar4 = std::operator<<(poVar4,(string *)&arg_struct);
    std::operator<<(poVar4,"(");
    f_iter_1._M_current = (t_field **)t_struct::get_members((t_struct *)proto.field_2._8_8_);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_1f0);
    local_1f8 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter_1._M_current);
    local_1f0._M_current = local_1f8;
    while( true ) {
      tfield_1 = (t_field *)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                           ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter_1._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1f0,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&tfield_1);
      if (!bVar1) break;
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1f0);
      local_208 = *pptVar5;
      psVar2 = t_field::get_name_abi_cxx11_(local_208);
      poVar4 = std::operator<<(out,(string *)psVar2);
      poVar4 = std::operator<<(poVar4,": ");
      psVar2 = t_field::get_name_abi_cxx11_(local_208);
      std::operator<<(poVar4,(string *)psVar2);
      p_Var6 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator++(&local_1f0);
      local_210._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter_1._M_current);
      bVar1 = __gnu_cxx::operator!=(p_Var6,&local_210);
      if (bVar1) {
        std::operator<<(out,", ");
      }
    }
    poVar4 = std::operator<<(out,")");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try ");
    poVar4 = std::operator<<(poVar4,(string *)&arg_struct);
    poVar4 = std::operator<<(poVar4,".writeValue(__args, toProtocol: __outProtocol)");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"try __outProtocol.writeMessageEnd()");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string((string *)&arg_struct);
  t_function::~t_function((t_function *)local_f0);
  std::__cxx11::string::~string((string *)&send_function.own_xceptions_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_send_function_implementation(ostream& out,
                                                                                   t_service *tservice,
                                                                                   t_function* tfunction,
                                                                                   bool needs_protocol) {

  string funname = tfunction->get_name();

  t_function send_function(g_type_bool,
                           "send_" + tfunction->get_name(),
                           tfunction->get_arglist());

  string argsname = function_args_helper_struct_type(tservice, tfunction);
  t_struct* arg_struct = tfunction->get_arglist();

  string proto = needs_protocol ? (gen_cocoa_ ? "__outProtocol" : "on outProtocol") : "";
  // Open function
  indent(out) << "private func " << send_function.get_name() << "("
              << argument_list(tfunction->get_arglist(), proto, true)
              << ") throws";
  block_open(out);
  if (!gen_cocoa_) {
    // Serialize the request
    indent(out) << "try outProtocol.writeMessageBegin(name: \"" << funname << "\", "
                << "type: " << (tfunction->is_oneway() ? ".oneway" : ".call") << ", "
                << "sequenceID: 0)" << endl;

    indent(out) << "let args = " << argsname << "(";

    // write out function parameters

    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field *tfield = (*f_iter);
      out << tfield->get_name() << ": " << tfield->get_name();
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
    out << ")" << endl;
    indent(out) << "try args.write(to: outProtocol)" << endl;
    indent(out) << "try outProtocol.writeMessageEnd()" << endl;
  } else {
    out << endl;

    // Serialize the request
    indent(out) << "try __outProtocol.writeMessageBeginWithName(\"" << funname << "\", "
                << "type: " << (tfunction->is_oneway() ? ".ONEWAY" : ".CALL") << ", "
                << "sequenceID: 0)" << endl;

    out << endl;

    indent(out) << "let __args = " << argsname << "(";

    // write out function parameters

    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    for (f_iter = fields.begin(); f_iter != fields.end();) {
      t_field *tfield = (*f_iter);
      out << tfield->get_name() << ": " << tfield->get_name();
      if (++f_iter != fields.end()) {
        out << ", ";
      }
    }
    out << ")" << endl;
    indent(out) << "try " << argsname << ".writeValue(__args, toProtocol: __outProtocol)" << endl << endl;
    indent(out) << "try __outProtocol.writeMessageEnd()" << endl;
  }

  block_close(out);
  out << endl;
}